

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

fft_plan *
fft_plan_dft_r2c_1d(fft_plan *__return_storage_ptr__,int n,double *in,fft_complex *out,uint flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  double *pdVar5;
  int *piVar6;
  fft_plan *output;
  uint flags_local;
  fft_complex *out_local;
  double *in_local;
  int n_local;
  
  memset(__return_storage_ptr__,0,0x48);
  __return_storage_ptr__->n = n;
  __return_storage_ptr__->in = in;
  __return_storage_ptr__->c_in = (fft_complex *)0x0;
  __return_storage_ptr__->out = (double *)0x0;
  __return_storage_ptr__->c_out = out;
  __return_storage_ptr__->sign = 1;
  __return_storage_ptr__->flags = flags;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  __return_storage_ptr__->input = pdVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)n;
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar4);
  __return_storage_ptr__->ip = piVar6;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)((n * 5) / 4);
  uVar4 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  __return_storage_ptr__->w = pdVar5;
  *__return_storage_ptr__->ip = 0;
  makewt(__return_storage_ptr__->n >> 2,__return_storage_ptr__->ip,__return_storage_ptr__->w);
  makect(__return_storage_ptr__->n >> 2,__return_storage_ptr__->ip,
         __return_storage_ptr__->w + (__return_storage_ptr__->n >> 2));
  return __return_storage_ptr__;
}

Assistant:

fft_plan fft_plan_dft_r2c_1d(int n, double *in, fft_complex *out,
    unsigned int flags) {
  void makewt(int nw, int *ip, double *w);
  void makect(int nc, int *ip, double *c);

  fft_plan output = {0};
  output.n = n;
  output.in = in;
  output.c_in = NULL;
  output.out = NULL;
  output.c_out = out;
  output.sign = FFT_FORWARD;
  output.flags = flags;
  output.input = new double[n];
  output.ip = new int[n];
  output.w = new double[n * 5 / 4];

  output.ip[0] = 0;
  makewt(output.n >> 2, output.ip, output.w);
  makect(output.n >> 2, output.ip, output.w + (output.n >> 2));
  return output;
}